

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

void * xmlHashLookup3(xmlHashTablePtr hash,xmlChar *key,xmlChar *key2,xmlChar *key3)

{
  uint hashValue;
  undefined8 in_RAX;
  xmlHashEntry *pxVar1;
  void *pvVar2;
  int found;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  if (hash == (xmlHashTablePtr)0x0) {
    pvVar2 = (void *)0x0;
  }
  else {
    pvVar2 = (void *)0x0;
    if ((key != (xmlChar *)0x0) && (hash->size != 0)) {
      pvVar2 = (void *)0x0;
      hashValue = xmlHashValue(hash->randomSeed,key,key2,key3,(size_t *)0x0);
      pxVar1 = xmlHashFindEntry(hash,key,key2,key3,hashValue,&local_34);
      if (local_34 != 0) {
        pvVar2 = pxVar1->payload;
      }
    }
  }
  return pvVar2;
}

Assistant:

void *
xmlHashLookup3(xmlHashTablePtr hash, const xmlChar *key,
               const xmlChar *key2, const xmlChar *key3) {
    const xmlHashEntry *entry;
    unsigned hashValue;
    int found;

    if ((hash == NULL) || (hash->size == 0) || (key == NULL))
        return(NULL);
    hashValue = xmlHashValue(hash->randomSeed, key, key2, key3, NULL);
    entry = xmlHashFindEntry(hash, key, key2, key3, hashValue, &found);
    if (found)
        return(entry->payload);
    return(NULL);
}